

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O1

void findScaleSpaceExtrema
               (vector<extrema,_std::allocator<extrema>_> *KP,
               vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
               *dogScaleSpace,Mat *image,uint *cnt)

{
  pointer pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uchar *puVar5;
  size_t sVar6;
  pointer pdVar7;
  pointer pdVar8;
  bool bVar9;
  long lVar10;
  long lVar11;
  ostream *poVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  float s;
  float fVar22;
  float fVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined1 auVar26 [8];
  double dVar27;
  Matx<float,_3,_1> x;
  __m128 t;
  extrema tmpKp;
  Matx31f dD2;
  Vec3f dD;
  Matx33f H;
  double val;
  uint local_1e4;
  uint local_1e0;
  uint local_1dc;
  undefined1 local_1d8 [8];
  pointer pdStack_1d0;
  pointer pdStack_1c8;
  double local_1b8;
  uint local_1ac;
  float local_1a8;
  undefined4 uStack_1a4;
  float local_1a0;
  undefined4 uStack_19c;
  pointer local_198;
  ulong local_190;
  double local_188;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  float local_16c;
  value_type local_168;
  ulong local_f8;
  float fStack_f0;
  float fStack_ec;
  vector<double,_std::allocator<double>_> local_e8;
  vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
  *local_d0;
  Point2f local_c4;
  float local_bc [3];
  Matx<float,_3,_1> local_b0;
  Matx<float,_3,_3> local_a4;
  vector<extrema,_std::allocator<extrema>_> *local_80;
  ulong local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  uint *local_48;
  double local_40;
  double local_38;
  
  local_1e4 = 0;
  local_d0 = dogScaleSpace;
  local_80 = KP;
  local_48 = cnt;
  do {
    local_1e0 = 1;
    pvVar1 = (dogScaleSpace->
             super__Vector_base<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((long)*(pointer *)
                ((long)&pvVar1[local_1e4].super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                        _M_impl.super__Vector_impl_data + 8) -
         *(long *)&pvVar1[local_1e4].super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                   super__Vector_impl_data >> 5) * -0x5555555555555555 - 3U < 0xfffffffffffffffe) {
      do {
        local_1dc = 5;
        if (*(int *)(*(long *)&(dogScaleSpace->
                               super__Vector_base<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[local_1e4].
                               super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                               super__Vector_impl_data + 8 + (ulong)local_1e0 * 0x60) - 0xbU <
            0xfffffffa) {
          do {
            local_1ac = 5;
            local_190 = (ulong)local_1e4;
            local_198 = (dogScaleSpace->
                        super__Vector_base<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
            local_f8 = (ulong)local_1e0;
            lVar10 = *(long *)&local_198[local_190].
                               super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                               super__Vector_impl_data;
            if (*(int *)(lVar10 + 0xc + local_f8 * 0x60) - 0xbU < 0xfffffffa) {
              local_198 = local_198 + local_190;
              lVar10 = lVar10 + local_f8 * 0x60;
              uVar21 = 5;
              do {
                *local_48 = *local_48 + 1;
                local_188 = (double)(long)(int)local_1dc;
                iVar20 = (int)uVar21;
                local_1b8 = (double)(long)iVar20;
                local_38 = (double)*(byte *)((long)local_1b8 +
                                            **(long **)(lVar10 + 0x48) * (long)local_188 +
                                            *(long *)(lVar10 + 0x10));
                local_168.octave = 9.0;
                bVar9 = findExtrema(dogScaleSpace,&local_38,&local_1e4,&local_1e0,&local_1dc,
                                    &local_1ac,&local_168.octave);
                dVar27 = local_1b8;
                if (bVar9) {
                  local_168.NeighborCells.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_168.NeighborCells.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_168.NeighborCells.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_168.cell_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_168.cell_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_168.keypoint_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_168.cell_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_168.keypoint_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start = (pointer)0x0;
                  local_168.keypoint_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_168.octave = (double)(local_190 & 0xffffffff);
                  local_168.layer = (int)local_f8;
                  local_68 = *(long *)&(local_198->
                                       super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>).
                                       _M_impl.super__Vector_impl_data;
                  local_60 = local_f8 * 0x60;
                  local_168.pt.y =
                       (float)image->cols *
                       ((float)((ulong)local_188 & 0xffffffff) /
                       (float)*(int *)(local_68 + 0xc + local_60));
                  local_168.pt.x =
                       (float)image->rows *
                       ((float)uVar21 / (float)*(int *)(local_68 + 8 + local_60));
                  local_58 = (ulong)(local_168.layer - 1) * 0x60;
                  lVar10 = *(long *)(local_68 + 0x10 + local_60);
                  lVar2 = **(long **)(local_68 + 0x48 + local_60);
                  lVar18 = lVar2 * (long)local_188 + lVar10;
                  local_198 = (pointer)(long)(iVar20 + 1);
                  lVar14 = (long)(iVar20 + -1);
                  local_f8 = (ulong)(SUB84(local_188,0) + 1);
                  lVar16 = lVar2 * local_f8 + lVar10;
                  local_190 = (ulong)(SUB84(local_188,0) + -1);
                  lVar10 = lVar2 * local_190 + lVar10;
                  local_70 = (ulong)(local_168.layer + 1) * 0x60;
                  lVar2 = *(long *)(local_68 + 0x10 + local_70);
                  lVar11 = **(long **)(local_68 + 0x48 + local_70);
                  lVar17 = lVar11 * (long)local_188 + lVar2;
                  lVar3 = **(long **)(local_68 + 0x48 + local_58);
                  lVar4 = *(long *)(local_68 + 0x10 + local_58);
                  lVar19 = lVar3 * (long)local_188 + lVar4;
                  local_b0.val[0] =
                       (float)(int)((uint)*(byte *)((long)local_198 + lVar18) -
                                   (uint)*(byte *)(lVar14 + lVar18)) * 0.0019607844;
                  local_b0.val[1] =
                       (float)(int)((uint)*(byte *)((long)local_1b8 + lVar16) -
                                   (uint)*(byte *)((long)local_1b8 + lVar10)) * 0.0019607844;
                  local_b0.val[2] =
                       (float)(int)((uint)*(byte *)((long)local_1b8 + lVar17) -
                                   (uint)*(byte *)((long)local_1b8 + lVar19)) * 0.0019607844;
                  fVar22 = (float)*(byte *)((long)local_1b8 + lVar18) +
                           (float)*(byte *)((long)local_1b8 + lVar18);
                  local_a4.val[0] =
                       ((float)((uint)*(byte *)(lVar14 + lVar18) +
                               (uint)*(byte *)((long)local_198 + lVar18)) - fVar22) * 0.003921569;
                  local_a4.val[4] =
                       ((float)((uint)*(byte *)((long)local_1b8 + lVar10) +
                               (uint)*(byte *)((long)local_1b8 + lVar16)) - fVar22) * 0.003921569;
                  local_a4.val[8] =
                       ((float)((uint)*(byte *)((long)local_1b8 + lVar19) +
                               (uint)*(byte *)((long)local_1b8 + lVar17)) - fVar22) * 0.003921569;
                  local_16c = (float)(int)((uint)*(byte *)(lVar14 + lVar10) +
                                          ((uint)*(byte *)((long)local_198 + lVar16) -
                                          ((uint)*(byte *)((long)local_198 + lVar10) +
                                          (uint)*(byte *)(lVar14 + lVar16)))) * 0.0009803922;
                  local_a4.val[2] =
                       (float)(int)((uint)*(byte *)(lVar14 + lVar19) +
                                   ((uint)*(byte *)((long)local_198 + lVar17) -
                                   ((uint)*(byte *)((long)local_198 + lVar19) +
                                   (uint)*(byte *)(lVar14 + lVar17)))) * 0.0009803922;
                  local_a4.val[5] =
                       (float)(int)((uint)*(byte *)((long)local_1b8 + lVar3 * local_190 + lVar4) +
                                   ((uint)*(byte *)((long)local_1b8 + lVar11 * local_f8 + lVar2) -
                                   ((uint)*(byte *)((long)local_1b8 + lVar3 * local_f8 + lVar4) +
                                   (uint)*(byte *)((long)local_1b8 + lVar11 * local_190 + lVar2))))
                       * 0.0009803922;
                  _local_1a0 = CONCAT44((int)((ulong)lVar4 >> 0x20),local_a4.val[0]);
                  _local_1a8 = CONCAT44((int)((ulong)lVar2 >> 0x20),local_a4.val[4]);
                  local_1d8 = (undefined1  [8])0x0;
                  pdStack_1d0 = (pointer)((ulong)pdStack_1d0 & 0xffffffff00000000);
                  local_a4.val[1] = local_16c;
                  local_a4.val[3] = local_16c;
                  local_a4.val[6] = local_a4.val[2];
                  local_a4.val[7] = local_a4.val[5];
                  local_78 = uVar21;
                  local_50 = lVar14;
                  bVar9 = cv::internal::Matx_FastSolveOp<float,_3,_3,_1>::operator()
                                    ((Matx_FastSolveOp<float,_3,_3,_1> *)&local_e8,&local_a4,
                                     &local_b0,(Matx<float,_3,_1> *)local_1d8,0);
                  auVar26 = local_1d8;
                  if (!bVar9) {
                    auVar26 = (undefined1  [8])(pointer)0x0;
                  }
                  fVar22 = (float)((ulong)auVar26 >> 0x20);
                  if (((bVar9 && 0.5 <= ABS(pdStack_1d0._0_4_)) || (0.5 <= ABS(fVar22))) ||
                     (0.5 <= ABS(SUB84(auVar26,0)))) {
                    if (bVar9) {
                      fVar23 = -pdStack_1d0._0_4_;
                    }
                    else {
                      fVar23 = -0.0;
                    }
                    fStack_f0 = -fVar22;
                    fStack_ec = -fVar22;
                    lVar10 = *(long *)(local_60 + local_68 + 0x10);
                    lVar2 = **(long **)(local_60 + local_68 + 0x48);
                    lVar11 = lVar2 * (long)local_188 + lVar10;
                    local_bc[0] = (float)(int)((uint)*(byte *)((long)local_198 + lVar11) -
                                              (uint)*(byte *)(lVar14 + lVar11)) * 0.0019607844;
                    local_bc[1] = (float)(int)((uint)*(byte *)((long)dVar27 +
                                                              local_f8 * lVar2 + lVar10) -
                                              (uint)*(byte *)((long)dVar27 +
                                                             local_190 * lVar2 + lVar10)) *
                                  0.0019607844;
                    local_bc[2] = (float)(int)((uint)*(byte *)((long)dVar27 +
                                                              **(long **)(local_70 + local_68 + 0x48
                                                                         ) * (long)local_188 +
                                                              *(long *)(local_70 + local_68 + 0x10))
                                              - (uint)*(byte *)((long)dVar27 +
                                                               (long)local_188 *
                                                               **(long **)(local_58 + local_68 +
                                                                          0x48) +
                                                               *(long *)(local_58 + local_68 + 0x10)
                                                               )) * 0.0019607844;
                    local_188 = (double)((ulong)auVar26 ^ 0x8000000080000000);
                    uStack_180 = 0x80000000;
                    uStack_17c = 0x80000000;
                    local_f8 = CONCAT44(fVar22,fVar22) ^ 0x8000000080000000;
                    local_1d8 = (undefined1  [8])((ulong)auVar26 ^ 0x8000000080000000);
                    pdStack_1d0 = (pointer)CONCAT44(pdStack_1d0._4_4_,fVar23);
                    fVar22 = 0.0;
                    lVar10 = 0;
                    do {
                      fVar22 = fVar22 + local_bc[lVar10] * *(float *)(local_1d8 + lVar10 * 4);
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 3);
                    dVar27 = (double)(ABS((float)*(byte *)(lVar11 + (long)dVar27) * 0.003921569 +
                                          fVar22 * 0.5) * 5.0);
                    if (0.03 <= dVar27) {
                      poVar12 = std::ostream::_M_insert<double>(dVar27);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) +
                                      (char)poVar12);
                      std::ostream::put((char)poVar12);
                      std::ostream::flush();
                      fVar22 = local_1a0 * local_1a8 - local_16c * local_16c;
                      if ((0.0 < fVar22) &&
                         ((local_1a0 + local_1a8) * (local_1a0 + local_1a8) * 10.0 < fVar22 * 121.0)
                         ) {
                        local_168.pt.y = (float)(int)ROUND((float)local_f8) + local_168.pt.y;
                        local_168.pt.x = (float)(int)ROUND(local_188._0_4_) + local_168.pt.x;
                        std::vector<double,_std::allocator<double>_>::resize
                                  (&local_168.keypoint_bin,0x24);
                        std::vector<double,_std::allocator<double>_>::resize(&local_168.cell_bin,8);
                        puVar5 = image->data;
                        sVar6 = *(image->step).p;
                        local_1b8 = (double)puVar5[(long)(int)(local_168.pt.x + 1.0) +
                                                   (long)(int)local_168.pt.y * sVar6] -
                                    (double)puVar5[(long)(int)(local_168.pt.x + -1.0) +
                                                   (long)(int)local_168.pt.y * sVar6];
                        local_188 = (double)puVar5[(long)(int)local_168.pt.x +
                                                   (long)(int)(local_168.pt.y + 1.0) * sVar6] -
                                    (double)puVar5[(long)(int)local_168.pt.x +
                                                   (long)(int)(local_168.pt.y + -1.0) * sVar6];
                        local_168.angle = calAngle(local_1b8,local_188);
                        local_168.magnitude = pow(local_1b8 * local_1b8 + local_188 * local_188,0.5)
                        ;
                        dVar27 = exp2((double)(local_168.layer + -1) * 0.5 + local_168.octave);
                        local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start = (pointer)(dVar27 * 1.5);
                        keypoint_Orientation
                                  ((vector<double,_std::allocator<double>_> *)local_1d8,image,
                                   &local_168.pt,(double *)&local_e8);
                        pdVar8 = local_168.keypoint_bin.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage;
                        pdVar7 = local_168.keypoint_bin.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                        local_168.keypoint_bin.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start = (pointer)local_1d8;
                        local_168.keypoint_bin.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish = pdStack_1d0;
                        local_168.keypoint_bin.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage = pdStack_1c8;
                        local_1d8 = (undefined1  [8])0x0;
                        pdStack_1d0 = (pointer)0x0;
                        pdStack_1c8 = (pointer)0x0;
                        if (pdVar7 != (pointer)0x0) {
                          operator_delete(pdVar7,(long)pdVar8 - (long)pdVar7);
                        }
                        if (local_1d8 != (undefined1  [8])0x0) {
                          operator_delete((void *)local_1d8,(long)pdStack_1c8 - (long)local_1d8);
                        }
                        iVar20 = 0;
                        do {
                          local_1b8 = (double)CONCAT44(local_1b8._4_4_,(float)(iVar20 * 4));
                          iVar13 = 0;
                          do {
                            local_1d8 = (undefined1  [8])0x0;
                            pdStack_1d0 = (pointer)0x0;
                            pdStack_1c8 = (pointer)0x0;
                            local_c4.x = (float)(iVar13 * 4) + local_168.pt.x + -7.0;
                            local_c4.y = local_168.pt.y + local_1b8._0_4_ + -7.0;
                            if ((long)local_168.keypoint_bin.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)local_168.keypoint_bin.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start == 0) {
                              local_40 = 0.0;
                            }
                            else {
                              lVar10 = (long)local_168.keypoint_bin.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_168.keypoint_bin.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start >> 3;
                              uVar15 = 0;
                              uVar21 = 0;
                              uVar24 = 0xe2308c3a;
                              uVar25 = 0x3e45798e;
                              do {
                                dVar27 = local_168.keypoint_bin.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[uVar15];
                                if ((double)CONCAT44(uVar25,uVar24) <= dVar27 &&
                                    dVar27 != (double)CONCAT44(uVar25,uVar24)) {
                                  uVar21 = uVar15 & 0xffffffff;
                                }
                                if (dVar27 <= (double)CONCAT44(uVar25,uVar24)) {
                                  dVar27 = (double)CONCAT44(uVar25,uVar24);
                                }
                                uVar15 = uVar15 + 1;
                                uVar24 = SUB84(dVar27,0);
                                uVar25 = (undefined4)((ulong)dVar27 >> 0x20);
                              } while (lVar10 + (ulong)(lVar10 == 0) != uVar15);
                              local_40 = (double)((int)uVar21 * 10);
                            }
                            calcOrientationHist(&local_e8,image,&local_c4,&local_168.pt,&local_40);
                            pdVar7 = pdStack_1c8;
                            auVar26 = local_1d8;
                            local_1d8 = (undefined1  [8])
                                        local_e8.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                            pdStack_1d0 = local_e8.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish;
                            pdStack_1c8 = local_e8.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage;
                            local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)0x0;
                            local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            if (auVar26 != (undefined1  [8])0x0) {
                              operator_delete((void *)auVar26,(long)pdVar7 - (long)auVar26);
                            }
                            if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_e8.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start,
                                              (long)local_e8.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_e8.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            std::
                            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ::push_back(&local_168.NeighborCells,
                                        (vector<double,_std::allocator<double>_> *)local_1d8);
                            if (local_1d8 != (undefined1  [8])0x0) {
                              operator_delete((void *)local_1d8,(long)pdStack_1c8 - (long)local_1d8)
                              ;
                            }
                            iVar13 = iVar13 + 1;
                          } while (iVar13 != 4);
                          iVar20 = iVar20 + 1;
                        } while (iVar20 != 4);
                        std::vector<extrema,_std::allocator<extrema>_>::push_back
                                  (local_80,&local_168);
                        std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::~vector(&local_168.NeighborCells);
                        if (local_168.cell_bin.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_168.cell_bin.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start,
                                          (long)local_168.cell_bin.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_168.cell_bin.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start);
                        }
                        dogScaleSpace = local_d0;
                        uVar21 = local_78;
                        if (local_168.keypoint_bin.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_168.keypoint_bin.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start,
                                          (long)local_168.keypoint_bin.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_168.keypoint_bin.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start);
                          dogScaleSpace = local_d0;
                          uVar21 = local_78;
                        }
                        goto LAB_001066c6;
                      }
                    }
                  }
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::~vector(&local_168.NeighborCells);
                  if (local_168.cell_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_168.cell_bin.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_168.cell_bin.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_168.cell_bin.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  dogScaleSpace = local_d0;
                  if (local_168.keypoint_bin.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_168.keypoint_bin.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_168.keypoint_bin.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_168.keypoint_bin.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                    dogScaleSpace = local_d0;
                  }
                  break;
                }
LAB_001066c6:
                local_1ac = (int)uVar21 + 1;
                uVar21 = (ulong)local_1ac;
                local_190 = (ulong)local_1e4;
                local_198 = (dogScaleSpace->
                            super__Vector_base<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + local_190;
                local_f8 = (ulong)local_1e0;
                lVar2 = *(long *)&(local_198->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)
                                  ._M_impl.super__Vector_impl_data;
                lVar10 = lVar2 + local_f8 * 0x60;
              } while (local_1ac < *(int *)(lVar2 + 0xc + local_f8 * 0x60) - 5U);
            }
            local_1dc = local_1dc + 1;
          } while (local_1dc <
                   *(int *)(*(long *)&(dogScaleSpace->
                                      super__Vector_base<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[local_1e4].
                                      super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                                      super__Vector_impl_data + 8 + (ulong)local_1e0 * 0x60) - 5U);
        }
        local_1e0 = local_1e0 + 1;
        pvVar1 = (dogScaleSpace->
                 super__Vector_base<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while ((ulong)local_1e0 <
               ((long)*(pointer *)
                       ((long)&pvVar1[local_1e4].
                               super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                               super__Vector_impl_data + 8) -
                *(long *)&pvVar1[local_1e4].super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                          _M_impl.super__Vector_impl_data >> 5) * -0x5555555555555555 - 1U);
    }
    local_1e4 = local_1e4 + 1;
    if (3 < local_1e4) {
      return;
    }
  } while( true );
}

Assistant:

void findScaleSpaceExtrema(vector<extrema>& KP, const vector<vector<Mat> >& dogScaleSpace, const Mat& image, unsigned& cnt){
    for(unsigned i = 0; i < octave; i++){
        for(unsigned j = 1; j < dogScaleSpace[i].size()-1; j++){
            for(unsigned r = border; r < dogScaleSpace[i][j].rows-border; r++){
                for(unsigned c = border; c < dogScaleSpace[i][j].cols-border; c++){
                    cnt ++;
                    double val = (double)dogScaleSpace[i][j].at<uchar>(r,c);
                    if( findExtrema(dogScaleSpace, val, i, j, r, c, thres)){
                        extrema tmpKp;
                        double tangentR, tangentC, angle;
                        tmpKp.octave = i;
                        tmpKp.layer = j;
                        const Mat& img = dogScaleSpace[i][j];
                        // tmpKp.pt.y = r / (double)img.cols * (double)image.cols;
                        // tmpKp.pt.x = c / (double)img.rows * (double)image.rows;
                        tmpKp.pt = Point2f (c / (double)img.rows * (double)image.rows, r / (double)img.cols * (double)image.cols);

////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
                        const float img_scale = 1.f/(255);
                        const float deriv_scale = img_scale*0.5f;
                        const float second_deriv_scale = img_scale;
                        const float cross_deriv_scale = img_scale*0.25f;

                        const Mat& prev = dogScaleSpace[i][j-1];
                        const Mat& next = dogScaleSpace[i][j+1];
                        float xi, xr, xc, contr;

                        Vec3f dD((img.at<uchar>(r, c+1) - img.at<uchar>(r, c-1))*deriv_scale,
                                (img.at<uchar>(r+1, c) - img.at<uchar>(r-1, c))*deriv_scale,
                                (next.at<uchar>(r, c) - prev.at<uchar>(r, c))*deriv_scale);
                        
                        float v2 = (float)img.at<uchar>(r, c)*2;
                        float dxx = (img.at<uchar>(r, c+1) + img.at<uchar>(r, c-1) - v2)*second_deriv_scale;
                        float dyy = (img.at<uchar>(r+1, c) + img.at<uchar>(r-1, c) - v2)*second_deriv_scale;
                        float dss = (next.at<uchar>(r, c) + prev.at<uchar>(r, c) - v2)*second_deriv_scale;
                        float dxy = (img.at<uchar>(r+1, c+1) - img.at<uchar>(r+1, c-1) -
                                    img.at<uchar>(r-1, c+1) + img.at<uchar>(r-1, c-1))*cross_deriv_scale;
                        float dxs = (next.at<uchar>(r, c+1) - next.at<uchar>(r, c-1) -
                                    prev.at<uchar>(r, c+1) + prev.at<uchar>(r, c-1))*cross_deriv_scale;
                        float dys = (next.at<uchar>(r+1, c) - next.at<uchar>(r-1, c) -
                                    prev.at<uchar>(r+1, c) + prev.at<uchar>(r-1, c))*cross_deriv_scale;
                        
                        Matx33f H(dxx, dxy, dxs,
                                  dxy, dyy, dys,
                                  dxs, dys, dss);

                        Vec3f X = H.solve(dD, DECOMP_LU);

                        xi = -X[2];
                        xr = -X[1];
                        xc = -X[0];

                        if( std::abs(xi) < 0.5f && std::abs(xr) < 0.5f && std::abs(xc) < 0.5f )
                            break;
                        
                        Matx31f dD2((img.at<uchar>(r, c+1) - img.at<uchar>(r, c-1))*deriv_scale,
                                   (img.at<uchar>(r+1, c) - img.at<uchar>(r-1, c))*deriv_scale,
                                   (next.at<uchar>(r, c) - prev.at<uchar>(r, c))*deriv_scale);
                        float t = dD2.dot(Matx31f(xc, xr, xi));
                        contr = img.at<uchar>(r,c)*img_scale + t*0.5f;
                        if( abs( contr ) * octaveLayer < 0.03 )
                            break;
                        cout << abs( contr ) * octaveLayer << endl;
                        
                        double edgeThreshold = 10.0;
                        float tr = dxx + dyy;
                        float det = dxx * dyy - dxy * dxy;
                        if( det <= 0 || tr*tr*edgeThreshold >= (edgeThreshold + 1)*(edgeThreshold + 1)*det )
                            break;

                        // cout << xi << "  "<< xr << "  "<< xc <<endl;
                        // if(std::abs(xi) > 1 || std::abs(xr) > 1 || std::abs(xc) < 1)
                        //     break;
                        tmpKp.pt.x += cvRound(xc);
                        tmpKp.pt.y += cvRound(xr);
////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
                        tmpKp.keypoint_bin.resize(36);
                        tmpKp.cell_bin.resize(8);
                        tangentC = (double)image.at<uchar>(tmpKp.pt.y, tmpKp.pt.x+1) - (double)image.at<uchar>(tmpKp.pt.y, tmpKp.pt.x-1);
                        tangentR = (double)image.at<uchar>(tmpKp.pt.y+1, tmpKp.pt.x) - (double)image.at<uchar>(tmpKp.pt.y-1, tmpKp.pt.x);
                        angle = calAngle(tangentC, tangentR);
                        tmpKp.angle = angle;
                        tmpKp.magnitude = pow(tangentC * tangentC + tangentR * tangentR, 0.5);
                        tmpKp.keypoint_bin = keypoint_Orientation(image, tmpKp.pt, 1.5 * pow(2,(tmpKp.layer-1)/2.0 + tmpKp.octave));

                        for(unsigned row_cell = 0; row_cell < block_width; row_cell++){
                            for(unsigned col_cell = 0; col_cell < block_width; col_cell++){
                                vector<double> tmpCell;
                                tmpCell = calcOrientationHist(image, Point2f(tmpKp.pt.x + col_cell*block_width - 7, tmpKp.pt.y + row_cell*block_width - 7),
                                                                tmpKp.pt, Max(tmpKp.keypoint_bin).second * 10);
                                tmpKp.NeighborCells.push_back(tmpCell);
                            }
                        }
                        KP.push_back(tmpKp);
                    }
                }
            }
        }
    }
}